

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loader.c
# Opt level: O0

void loader_unload_children(loader_impl impl)

{
  long lVar1;
  long *plVar2;
  loader_impl impl_00;
  long in_RDI;
  loader_impl destroyed_impl;
  loader_initialization_order order_1;
  loader_initialization_order order;
  vector stack;
  size_t size;
  size_t iterator;
  uint64_t current;
  loader_manager_impl manager_impl;
  loader_impl in_stack_ffffffffffffffc0;
  long *local_38;
  undefined8 local_30;
  ulong local_28;
  ulong local_20;
  long local_18;
  long *local_10;
  long local_8;
  
  local_8 = in_RDI;
  local_10 = (long *)plugin_manager_impl(&loader_manager);
  local_18 = thread_id_get_current();
  local_28 = vector_size(local_10[1]);
  local_30 = vector_create(8);
  for (local_20 = 0; local_20 < local_28; local_20 = local_20 + 1) {
    local_38 = (long *)vector_at(local_10[1],local_20);
    if ((((int)local_38[2] == 1) && (local_38[1] != 0)) && (local_18 == *local_38)) {
      vector_push_back(local_30,&local_38);
      *(undefined4 *)(local_38 + 2) = 0;
    }
  }
  while (lVar1 = vector_size(local_30), lVar1 != 0) {
    plVar2 = (long *)vector_back(local_30);
    in_stack_ffffffffffffffc0 = (loader_impl)*plVar2;
    if (*(vector *)&in_stack_ffffffffffffffc0->init != (vector)*local_10) {
      impl_00 = (loader_impl)plugin_impl(*(vector *)&in_stack_ffffffffffffffc0->init);
      plugin_destroy_delayed(*(vector *)&in_stack_ffffffffffffffc0->init);
      loader_manager_impl_set_destroyed((loader_manager_impl)in_stack_ffffffffffffffc0,impl_00);
    }
    *(undefined4 *)&in_stack_ffffffffffffffc0->handle_impl_path_map = 1;
    *(vector *)&in_stack_ffffffffffffffc0->init = (vector)0x0;
    in_stack_ffffffffffffffc0->p = (plugin)0xffffffffffffffff;
    vector_pop_back(local_30);
  }
  vector_destroy(local_30);
  if (local_8 != 0) {
    loader_impl_destroy_objects(in_stack_ffffffffffffffc0);
  }
  return;
}

Assistant:

void loader_unload_children(loader_impl impl)
{
	loader_manager_impl manager_impl = plugin_manager_impl_type(&loader_manager, loader_manager_impl);
	uint64_t current = thread_id_get_current();
	size_t iterator, size = vector_size(manager_impl->initialization_order);
	vector stack = vector_create_type(loader_initialization_order);

	/* Get all loaders that have been initialized in the current thread */
	for (iterator = 0; iterator < size; ++iterator)
	{
		loader_initialization_order order = vector_at(manager_impl->initialization_order, iterator);

		if (order->being_deleted == 1 && order->p != NULL && current == order->id)
		{
			/* Mark for deletion */
			vector_push_back(stack, &order);

			/* Start to delete the current loader */
			order->being_deleted = 0;
		}
	}

	/* Free all loaders of the current thread and with BFS, look for children */
	while (vector_size(stack) != 0)
	{
		loader_initialization_order order = vector_back_type(stack, loader_initialization_order);

		/* TODO: Disable logs here until log is completely thread safe and async signal safe */
		/* log_write("metacall", LOG_LEVEL_DEBUG, "Loader unloading (%s) from thread #%" PRIuS, plugin_name(order->p), order->id); */

		/* Call recursively for deletion of children */
		if (order->p != manager_impl->host)
		{
			loader_impl destroyed_impl = plugin_impl_type(order->p, loader_impl);

			/* This will execute the desctructor but it will prevent to unload the plugins.
			* This is necessary in order to protect the destruction of the memory, otherwhise
			* it can happen that a node function wrapping a python function get destroyed after
			* the loader has been unloaded, and the function interface will point to an unloaded
			* plugin, generating a segmentation fault. All the plugins will be unloaded on plugin_manager_destroy.
			*/
			plugin_destroy_delayed(order->p);

			/* Mark loader as destroyed (prevents access to already freed memory and defines what loaders are destroyed) */
			loader_manager_impl_set_destroyed(manager_impl, destroyed_impl);
		}

		/* Clear current order */
		order->being_deleted = 1;
		order->p = NULL;
		order->id = THREAD_ID_INVALID;

		vector_pop_back(stack);
	}

	vector_destroy(stack);

	/* Clear all objects and types related to the loader once all childs have been destroyed */
	if (impl != NULL)
	{
		loader_impl_destroy_objects(impl);
	}
}